

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderCancelRequest.h
# Opt level: O0

void __thiscall
FIX40::OrderCancelRequest::OrderCancelRequest
          (OrderCancelRequest *this,OrigClOrdID *aOrigClOrdID,ClOrdID *aClOrdID,CxlType *aCxlType,
          Symbol *aSymbol,Side *aSide,OrderQty *aOrderQty)

{
  MsgType local_90;
  Side *local_38;
  Side *aSide_local;
  Symbol *aSymbol_local;
  CxlType *aCxlType_local;
  ClOrdID *aClOrdID_local;
  OrigClOrdID *aOrigClOrdID_local;
  OrderCancelRequest *this_local;
  
  local_38 = aSide;
  aSide_local = (Side *)aSymbol;
  aSymbol_local = (Symbol *)aCxlType;
  aCxlType_local = (CxlType *)aClOrdID;
  aClOrdID_local = (ClOrdID *)aOrigClOrdID;
  aOrigClOrdID_local = (OrigClOrdID *)this;
  MsgType();
  FIX40::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__OrderCancelRequest_0018a230;
  set(this,(OrigClOrdID *)aClOrdID_local);
  set(this,(ClOrdID *)aCxlType_local);
  set(this,(CxlType *)aSymbol_local);
  set(this,(Symbol *)aSide_local);
  set(this,local_38);
  set(this,aOrderQty);
  return;
}

Assistant:

OrderCancelRequest(
      const FIX::OrigClOrdID& aOrigClOrdID,
      const FIX::ClOrdID& aClOrdID,
      const FIX::CxlType& aCxlType,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::OrderQty& aOrderQty )
    : Message(MsgType())
    {
      set(aOrigClOrdID);
      set(aClOrdID);
      set(aCxlType);
      set(aSymbol);
      set(aSide);
      set(aOrderQty);
    }